

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fetch.hpp
# Opt level: O1

void __thiscall
TI::TMS::Base<(TI::TMS::Personality)1>::fetch_yamaha<(TI::TMS::ScreenMode)3>
          (Base<(TI::TMS::Personality)1> *this,uint8_t y,int end)

{
  ushort uVar1;
  Event *pEVar2;
  Event *pEVar3;
  SpriteFetcher<(TI::TMS::Personality)1,_(TI::TMS::SpriteMode)0> sprite_fetcher;
  CharacterFetcher<(TI::TMS::Personality)1> character_fetcher;
  SpriteFetcher<(TI::TMS::Personality)1,_(TI::TMS::SpriteMode)0> local_58;
  CharacterFetcher<(TI::TMS::Personality)1> local_48;
  
  CharacterFetcher<(TI::TMS::Personality)1>::CharacterFetcher(&local_48,this,y);
  pEVar2 = (this->super_Storage<(TI::TMS::Personality)1,_void>).super_YamahaFetcher.next_event_;
  uVar1 = pEVar2->offset;
  local_58.base = this;
  local_58.y = y;
  while ((int)(uint)uVar1 < end) {
    switch(pEVar2->type) {
    case External:
      do_external_slot(this,(uint)uVar1);
      break;
    case SpriteY:
      posit_sprite(local_58.base,(uint)pEVar2->id,
                   (uint)((local_58.base)->ram_)._M_elems
                         [((uint)pEVar2->id * 4 | 0xffffff80) &
                          (local_58.base)->sprite_attribute_table_address_],local_58.y);
      break;
    case SpriteLocation:
      (local_58.base)->fetch_sprite_buffer_->active_sprites[pEVar2->id].x =
           (uint)((local_58.base)->ram_)._M_elems
                 [((local_58.base)->fetch_sprite_buffer_->active_sprites[pEVar2->id].index << 2 |
                  0xffffff81U) & (local_58.base)->sprite_attribute_table_address_];
      break;
    case SpritePattern:
      SpriteFetcher<(TI::TMS::Personality)1,_(TI::TMS::SpriteMode)0>::fetch_image
                (&local_58,(uint)pEVar2->id,
                 ((local_58.base)->sprites_16x16_ - 1U | 0xfc) &
                 ((local_58.base)->ram_)._M_elems
                 [((local_58.base)->fetch_sprite_buffer_->active_sprites[pEVar2->id].index << 2 |
                  0xffffff82U) & (local_58.base)->sprite_attribute_table_address_]);
      break;
    case Name:
      (local_48.base)->tile_offset_ =
           (uint)((local_48.base)->ram_)._M_elems[pEVar2->id + local_48.row_base];
      break;
    case Colour:
      ((local_48.base)->fetch_line_buffer_->field_5).bitmap[(ulong)pEVar2->id * 4 + 0x21] =
           ((local_48.base)->ram_)._M_elems
           [(((local_48.base)->tile_offset_ << 3) >> ((byte)local_48.colour_name_shift & 0x1f)) +
            local_48.colour_base];
      break;
    case Pattern:
      ((local_48.base)->fetch_line_buffer_->field_5).bitmap[(ulong)pEVar2->id * 4 + 0x20] =
           ((local_48.base)->ram_)._M_elems
           [(local_48.base)->tile_offset_ * 8 + local_48.pattern_base];
    }
    pEVar3 = (this->super_Storage<(TI::TMS::Personality)1,_void>).super_YamahaFetcher.next_event_;
    pEVar2 = pEVar3 + 1;
    (this->super_Storage<(TI::TMS::Personality)1,_void>).super_YamahaFetcher.next_event_ = pEVar2;
    uVar1 = pEVar3[1].offset;
  }
  return;
}

Assistant:

void Base<personality>::fetch_yamaha(uint8_t y, int end) {
	CharacterFetcher character_fetcher(this, y);
	TextFetcher text_fetcher(this, y);
	SpriteFetcher<personality, sprite_mode(mode)> sprite_fetcher(this, y);

	using Type = typename Storage<personality>::Event::Type;
	while(Storage<personality>::next_event_->offset < end) {
		switch(Storage<personality>::next_event_->type) {
			case Type::External:
				do_external_slot(Storage<personality>::next_event_->offset);
			break;

			case Type::Name:
				switch(mode) {
					case ScreenMode::Text: {
						const auto column = AddressT(Storage<personality>::next_event_->id << 1);

						text_fetcher.fetch_name(column, 0);
						text_fetcher.fetch_name(column + 1, 1);
					} break;

					case ScreenMode::YamahaText80: {
						const auto column = AddressT(Storage<personality>::next_event_->id << 2);
						const auto start = pattern_name_address_ & bits<12>(AddressT((y >> 3) * 80));

						name_[0] = ram_[start + column + 0];
						name_[1] = ram_[start + column + 1];
						name_[2] = ram_[start + column + 2];
						name_[3] = ram_[start + column + 3];
					} break;

					case ScreenMode::Graphics:
					case ScreenMode::MultiColour:
					case ScreenMode::ColouredText:
						character_fetcher.fetch_name(Storage<personality>::next_event_->id);
					break;

					default: break;
				}
			break;

			case Type::Colour:
				switch(mode) {
					case ScreenMode::YamahaText80: {
						const auto column = AddressT(Storage<personality>::next_event_->id);
						const auto address = colour_table_address_ & bits<9>(AddressT((y >> 3) * 10));
						auto &line_buffer = *fetch_line_buffer_;
						line_buffer.characters.flags[column] = ram_[address + column];
					} break;

					case ScreenMode::Graphics:
					case ScreenMode::MultiColour:
					case ScreenMode::ColouredText:
						character_fetcher.fetch_colour(Storage<personality>::next_event_->id);
					break;

					default: break;
				}
			break;

			case Type::Pattern:
				switch(mode) {
					case ScreenMode::Text: {
						const auto column = AddressT(Storage<personality>::next_event_->id << 1);

						text_fetcher.fetch_pattern(column, 0);
						text_fetcher.fetch_pattern(column + 1, 1);
					} break;

					case ScreenMode::YamahaText80: {
						const auto column = Storage<personality>::next_event_->id << 2;
						const auto start = pattern_generator_table_address_ & bits<11>(AddressT(y & 7));
						auto &line_buffer = *fetch_line_buffer_;

						line_buffer.characters.shapes[column + 0] = ram_[start + AddressT(name_[0] << 3)];
						line_buffer.characters.shapes[column + 1] = ram_[start + AddressT(name_[1] << 3)];
						line_buffer.characters.shapes[column + 2] = ram_[start + AddressT(name_[2] << 3)];
						line_buffer.characters.shapes[column + 3] = ram_[start + AddressT(name_[3] << 3)];
					} break;

					case ScreenMode::Graphics:
					case ScreenMode::MultiColour:
					case ScreenMode::ColouredText:
						character_fetcher.fetch_pattern(Storage<personality>::next_event_->id);
					break;

					case ScreenMode::YamahaGraphics3:
						// As per comment elsewhere; my _guess_ is that G3 is slotted as if it were
						// a bitmap mode, with the three bytes that describe each column fitting into
						// the relevant windows.
						character_fetcher.fetch_name(Storage<personality>::next_event_->id);
						character_fetcher.fetch_colour(Storage<personality>::next_event_->id);
						character_fetcher.fetch_pattern(Storage<personality>::next_event_->id);
					break;

					case ScreenMode::YamahaGraphics4:
					case ScreenMode::YamahaGraphics5: {
						const int column = Storage<personality>::next_event_->id << 2;
						const auto start = bits<15>((y << 7) | column);
						auto &line_buffer = *fetch_line_buffer_;

						line_buffer.bitmap[column + 0] = ram_[pattern_name_address_ & AddressT(start + 0)];
						line_buffer.bitmap[column + 1] = ram_[pattern_name_address_ & AddressT(start + 1)];
						line_buffer.bitmap[column + 2] = ram_[pattern_name_address_ & AddressT(start + 2)];
						line_buffer.bitmap[column + 3] = ram_[pattern_name_address_ & AddressT(start + 3)];
					} break;

					case ScreenMode::YamahaGraphics6:
					case ScreenMode::YamahaGraphics7: {
						const uint8_t *const ram2 = &ram_[65536];
						const int column = Storage<personality>::next_event_->id << 3;
						const auto start = bits<15>((y << 7) | (column >> 1));
						auto &line_buffer = *fetch_line_buffer_;

						// Fetch from alternate banks.
						line_buffer.bitmap[column + 0] = ram_[pattern_name_address_ & AddressT(start + 0) & 0xffff];
						line_buffer.bitmap[column + 1] = ram2[pattern_name_address_ & AddressT(start + 0) & 0xffff];
						line_buffer.bitmap[column + 2] = ram_[pattern_name_address_ & AddressT(start + 1) & 0xffff];
						line_buffer.bitmap[column + 3] = ram2[pattern_name_address_ & AddressT(start + 1) & 0xffff];
						line_buffer.bitmap[column + 4] = ram_[pattern_name_address_ & AddressT(start + 2) & 0xffff];
						line_buffer.bitmap[column + 5] = ram2[pattern_name_address_ & AddressT(start + 2) & 0xffff];
						line_buffer.bitmap[column + 6] = ram_[pattern_name_address_ & AddressT(start + 3) & 0xffff];
						line_buffer.bitmap[column + 7] = ram2[pattern_name_address_ & AddressT(start + 3) & 0xffff];
					} break;

					default: break;
				}
			break;

			case Type::SpriteY:
				switch(mode) {
					case ScreenMode::Blank:
					case ScreenMode::Text:
					case ScreenMode::YamahaText80:
						// Ensure the compiler can discard character_fetcher in these modes.
					break;

					default:
						sprite_fetcher.fetch_y(Storage<personality>::next_event_->id);
					break;
				}
			break;

			case Type::SpriteLocation:
				switch(mode) {
					case ScreenMode::Blank:
					case ScreenMode::Text:
					case ScreenMode::YamahaText80:
						// Ensure the compiler can discard character_fetcher in these modes.
					break;

					default:
						sprite_fetcher.fetch_location(Storage<personality>::next_event_->id);
					break;
				}
			break;

			case Type::SpritePattern:
				switch(mode) {
					case ScreenMode::Blank:
					case ScreenMode::Text:
					case ScreenMode::YamahaText80:
						// Ensure the compiler can discard character_fetcher in these modes.
					break;

					default:
						sprite_fetcher.fetch_pattern(Storage<personality>::next_event_->id);
					break;
				}
			break;

			default: break;
		}

		++Storage<personality>::next_event_;
	}
}